

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

void __thiscall mkvparser::Tags::~Tags(Tags *this)

{
  Tag *pTVar1;
  uint uVar2;
  long lVar3;
  
  while (0 < this->m_tags_count) {
    uVar2 = this->m_tags_count - 1;
    this->m_tags_count = uVar2;
    Tag::Clear(this->m_tags + uVar2);
  }
  pTVar1 = this->m_tags;
  if (pTVar1 != (Tag *)0x0) {
    lVar3._0_4_ = pTVar1[-1].m_simple_tags_size;
    lVar3._4_4_ = pTVar1[-1].m_simple_tags_count;
    if (lVar3 != 0) {
      lVar3 = lVar3 << 4;
      do {
        Tag::~Tag((Tag *)((long)&pTVar1[-1].m_simple_tags + lVar3));
        lVar3 = lVar3 + -0x10;
      } while (lVar3 != 0);
    }
    operator_delete__(&pTVar1[-1].m_simple_tags_size);
    return;
  }
  return;
}

Assistant:

Tags::~Tags() {
  while (m_tags_count > 0) {
    Tag& t = m_tags[--m_tags_count];
    t.Clear();
  }
  delete[] m_tags;
}